

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O0

void __thiscall Valve::findGpvHeadLoss(Valve *this,Network *nw,double q)

{
  double dVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa_00;
  double local_58;
  double h0;
  double r;
  double qRaw;
  double ucfHead;
  double ucfFlow;
  Curve *curve;
  double dStack_20;
  int curveIndex;
  double q_local;
  Network *nw_local;
  Valve *this_local;
  
  curve._4_4_ = (int)(this->super_Link).setting;
  dStack_20 = q;
  q_local = (double)nw;
  nw_local = (Network *)this;
  ucfFlow = (double)Network::curve(nw,curve._4_4_);
  ucfHead = Network::ucf((Network *)q_local,FLOW);
  dVar1 = q_local;
  qRaw = Network::ucf((Network *)q_local,LENGTH);
  std::abs(SUB84(dVar1,0));
  r = extraout_XMM0_Qa * ucfHead;
  dVar1 = ucfFlow;
  Curve::findSegment((Curve *)ucfFlow,r,&h0,&local_58);
  dVar2 = (ucfHead / qRaw) * h0;
  dVar3 = local_58 / qRaw;
  (this->super_Link).hGrad = dVar2;
  local_58 = dVar3;
  h0 = dVar2;
  std::abs(SUB84(dVar1,0));
  (this->super_Link).hLoss = dVar2 * extraout_XMM0_Qa_00 + dVar3;
  if (dStack_20 < 0.0) {
    (this->super_Link).hLoss = -(this->super_Link).hLoss;
  }
  return;
}

Assistant:

void Valve::findGpvHeadLoss(Network* nw, double q)
{
    // ... retrieve head loss curve for valve

    int curveIndex = (int)setting;
    Curve* curve = nw->curve(curveIndex);

    // ... retrieve units conversion factors (curve is in user's units)

    double ucfFlow = nw->ucf(Units::FLOW);
    double ucfHead = nw->ucf(Units::LENGTH);

    // ... find slope (r) and intercept (h0) of curve segment

    double qRaw = abs(q) * ucfFlow;
    double r, h0;
    curve->findSegment(qRaw, r, h0);

    // ... convert to internal units

    r *= ucfFlow / ucfHead;
    h0 /= ucfHead;

    // ... determine head loss and derivative for this curve segment

    hGrad = r; //+ 2.0 * lossFactor * abs(q);
    hLoss = h0 + r * abs(q); // + lossFactor * q * q;
    if ( q < 0.0 ) hLoss = -hLoss;
}